

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAddiRg<(moira::Instr)120,(moira::Mode)0,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 uVar1;
  
  uVar1 = readI<(moira::Size)2>(this);
  uVar1 = addsub<(moira::Instr)120,(moira::Size)2>
                    (this,uVar1,
                     (uint)*(ushort *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58));
  prefetch<4ul>(this);
  *(short *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = (short)uVar1;
  return;
}

Assistant:

void
Moira::execAddiRg(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S>(dst, ea, data)) return;

    result = addsub<I,S>(src, data);
    prefetch<POLLIPL>();

    if (S == Long) sync(4);
    writeD<S>(dst, result);
}